

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyLTP.hpp
# Opt level: O1

void njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearPlusInterference::
     verifyLTP(int LTP)

{
  undefined8 *puVar1;
  
  if ((1 < LTP - 0xeU) && (LTP != 0xc)) {
    tools::Log::error<char_const*>("Encountered illegal LTP value");
    tools::Log::info<char_const*>("LTP must be equal to 12, 14 or 15 for nuclear plus interference")
    ;
    tools::Log::info<char_const*,int>("LTP value: {}",LTP);
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = getenv;
    __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
  }
  return;
}

Assistant:

static void
verifyLTP( int LTP ) {

  if ( ( LTP != 12 ) and ( LTP != 14 ) and ( LTP != 15 ) ) {

    Log::error( "Encountered illegal LTP value" );
    Log::info( "LTP must be equal to 12, 14 or 15 for nuclear "
               "plus interference");
    Log::info( "LTP value: {}", LTP );
    throw std::exception();
  }
}